

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

int __thiscall
Js::
WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
::GetFreeItemIndex(WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
                   *this,List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                         *list)

{
  uint uVar1;
  int iVar2;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *list_local;
  WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  uVar1 = Memory::Recycler::GetWeakReferenceCleanupId
                    ((list->
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                     ).alloc);
  if (uVar1 != this->lastWeakReferenceCleanupId) {
    CleanupWeakReference(this,list);
  }
  iVar2 = FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
          ::GetFreeItemIndex(&this->
                              super_FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
                             ,list);
  return iVar2;
}

Assistant:

int GetFreeItemIndex(TListType * list)
        {
            if (list->alloc->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                CleanupWeakReference(list);
            }
            return __super::GetFreeItemIndex(list);
        }